

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O2

shared_ptr<gui::DialogBox> __thiscall EditorInterface::createSaveDialog(EditorInterface *this)

{
  Theme *pTVar1;
  _func_int **pp_Var2;
  DialogBox *pDVar3;
  _func_int **pp_Var4;
  element_type *this_00;
  element_type *this_01;
  size_type sVar5;
  _Link_type __p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::Button> *in_RSI;
  map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  *this_02;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar6;
  shared_ptr<gui::DialogBox> sVar7;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  locale local_148 [8];
  shared_ptr<gui::Button> saveCancelButton;
  shared_ptr<gui::Label> saveLabel;
  shared_ptr<gui::Button> saveRefuseButton;
  shared_ptr<gui::Button> saveSubmitButton;
  shared_ptr<gui::Label> saveTitle;
  undefined1 local_e0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 local_c0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined1 local_a0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  pTVar1 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)&saveTitle);
  sf::String::String((String *)&local_168,"saveDialog",(locale *)&saveTitle);
  ::gui::DialogBox::create((DialogBox *)(local_a0 + 0x10),pTVar1,(String *)&local_168);
  debugWidgetCreation<gui::DialogBox>(this,(shared_ptr<gui::DialogBox> *)in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_168);
  std::locale::~locale((locale *)&saveTitle);
  local_168._M_unused._M_object = (void *)0x42c8000043960000;
  ::gui::DialogBox::setSize
            ((DialogBox *)(this->super_Drawable)._vptr_Drawable,(Vector2f *)&local_168);
  pp_Var2 = (this->super_Drawable)._vptr_Drawable;
  (**(code **)(*pp_Var2 + 0x18))(pp_Var2,0);
  pp_Var2 = (this->super_Drawable)._vptr_Drawable;
  pTVar1 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)&saveLabel);
  sf::String::String((String *)&local_168,"saveTitle",(locale *)&saveLabel);
  ::gui::Label::create((Label *)local_a0,pTVar1,(String *)&local_168);
  debugWidgetCreation<gui::Label>((EditorInterface *)&saveTitle,(shared_ptr<gui::Label> *)in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_168);
  std::locale::~locale((locale *)&saveLabel);
  std::locale::locale((locale *)&saveLabel);
  sf::String::String((String *)&local_168,"Save Changes?",(locale *)&saveLabel);
  ::gui::Label::setLabel
            (saveTitle.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (String *)&local_168);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_168);
  std::locale::~locale((locale *)&saveLabel);
  pDVar3 = (DialogBox *)(this->super_Drawable)._vptr_Drawable;
  std::__shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&saveTitle.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>);
  ::gui::DialogBox::setTitle(pDVar3,(shared_ptr<gui::Label> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  pTVar1 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)&saveSubmitButton);
  sf::String::String((String *)&local_168,"saveLabel",(locale *)&saveSubmitButton);
  ::gui::Label::create((Label *)(local_c0 + 0x10),pTVar1,(String *)&local_168);
  debugWidgetCreation<gui::Label>((EditorInterface *)&saveLabel,(shared_ptr<gui::Label> *)in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_168);
  std::locale::~locale((locale *)&saveSubmitButton);
  this_01 = saveLabel.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::locale::locale((locale *)&saveSubmitButton);
  sf::String::String((String *)&local_168,"Board has been modified.",(locale *)&saveSubmitButton);
  ::gui::Label::setLabel(this_01,(String *)&local_168);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_168);
  std::locale::~locale((locale *)&saveSubmitButton);
  ::gui::Widget::setPosition
            (&(saveLabel.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Widget,10.0,30.0);
  pp_Var4 = (this->super_Drawable)._vptr_Drawable;
  std::__shared_ptr<gui::Widget,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::Label,void>
            (local_50,&saveLabel.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*pp_Var4 + 0x10))(pp_Var4,local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  pTVar1 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)&saveRefuseButton);
  sf::String::String((String *)&local_168,"saveSubmitButton",(locale *)&saveRefuseButton);
  ::gui::Button::create((Button *)local_c0,pTVar1,(String *)&local_168);
  debugWidgetCreation<gui::Button>((EditorInterface *)&saveSubmitButton,in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_168);
  std::locale::~locale((locale *)&saveRefuseButton);
  std::locale::locale((locale *)&saveRefuseButton);
  sf::String::String((String *)&local_168,"Save",(locale *)&saveRefuseButton);
  ::gui::Button::setLabel
            (saveSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (String *)&local_168);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_168);
  std::locale::~locale((locale *)&saveRefuseButton);
  pDVar3 = (DialogBox *)(this->super_Drawable)._vptr_Drawable;
  std::__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,&saveSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>
            );
  ::gui::DialogBox::setSubmitButton(pDVar3,0,(shared_ptr<gui::Button> *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  pTVar1 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)&saveCancelButton);
  sf::String::String((String *)&local_168,"saveRefuseButton",(locale *)&saveCancelButton);
  ::gui::Button::create((Button *)(local_e0 + 0x10),pTVar1,(String *)&local_168);
  debugWidgetCreation<gui::Button>((EditorInterface *)&saveRefuseButton,in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_168);
  std::locale::~locale((locale *)&saveCancelButton);
  std::locale::locale((locale *)&saveCancelButton);
  sf::String::String((String *)&local_168,"Don\'t Save",(locale *)&saveCancelButton);
  ::gui::Button::setLabel
            (saveRefuseButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (String *)&local_168);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_168);
  std::locale::~locale((locale *)&saveCancelButton);
  pDVar3 = (DialogBox *)(this->super_Drawable)._vptr_Drawable;
  std::__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,&saveRefuseButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>
            );
  ::gui::DialogBox::setOptionButton(pDVar3,1,(shared_ptr<gui::Button> *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  pTVar1 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale(local_148);
  sf::String::String((String *)&local_168,"saveCancelButton",local_148);
  ::gui::Button::create((Button *)local_e0,pTVar1,(String *)&local_168);
  debugWidgetCreation<gui::Button>((EditorInterface *)&saveCancelButton,in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_168);
  std::locale::~locale(local_148);
  this_00 = saveCancelButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::locale::locale(local_148);
  sf::String::String((String *)&local_168,"Cancel",local_148);
  ::gui::Button::setLabel(this_00,(String *)&local_168);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_168);
  std::locale::~locale(local_148);
  this_02 = &((saveCancelButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->onClick).callbacks_;
  while( true ) {
    sVar5 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
            ::count(this_02,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
    if (sVar5 == 0) break;
    ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  }
  __p = std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
        ::_M_get_node(&this_02->_M_t);
  *(int *)(__p->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
  local_150 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:573:39)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:573:39)>
              ::_M_manager;
  local_168._8_8_ = pp_Var2;
  ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::Callback
            ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
             ((__p->_M_storage)._M_storage + 8),(function<void_()> *)&local_168);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  pVar6 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::_M_get_insert_unique_pos(&this_02->_M_t,(key_type_conflict1 *)&__p->_M_storage);
  if (pVar6.second == (_Base_ptr)0x0) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_drop_node(&this_02->_M_t,__p);
  }
  else {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_insert_node(&this_02->_M_t,pVar6.first,pVar6.second,__p);
  }
  ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  pDVar3 = (DialogBox *)(this->super_Drawable)._vptr_Drawable;
  std::__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,&saveCancelButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>
            );
  ::gui::DialogBox::setCancelButton(pDVar3,2,(shared_ptr<gui::Button> *)&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&saveCancelButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&saveRefuseButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&saveSubmitButton.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&saveLabel.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&saveTitle.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar7.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar7.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<gui::DialogBox>)
         sVar7.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<gui::DialogBox> EditorInterface::createSaveDialog() const {
    auto saveDialog = debugWidgetCreation(gui::DialogBox::create(*theme_, "saveDialog"));
    saveDialog->setSize({300.0f, 100.0f});
    saveDialog->setVisible(false);
    auto saveDialogPtr = saveDialog.get();

    auto saveTitle = debugWidgetCreation(gui::Label::create(*theme_, "saveTitle"));
    saveTitle->setLabel("Save Changes?");
    saveDialog->setTitle(saveTitle);

    auto saveLabel = debugWidgetCreation(gui::Label::create(*theme_, "saveLabel"));
    saveLabel->setLabel("Board has been modified.");
    saveLabel->setPosition(10.0f, 30.0f);
    saveDialog->addChild(saveLabel);

    auto saveSubmitButton = debugWidgetCreation(gui::Button::create(*theme_, "saveSubmitButton"));
    saveSubmitButton->setLabel("Save");
    saveDialog->setSubmitButton(0, saveSubmitButton);

    auto saveRefuseButton = debugWidgetCreation(gui::Button::create(*theme_, "saveRefuseButton"));
    saveRefuseButton->setLabel("Don\'t Save");
    saveDialog->setOptionButton(1, saveRefuseButton);

    auto saveCancelButton = debugWidgetCreation(gui::Button::create(*theme_, "saveCancelButton"));
    saveCancelButton->setLabel("Cancel");
    saveCancelButton->onClick.connect([this,saveDialogPtr]() {
        saveDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
    });
    saveDialog->setCancelButton(2, saveCancelButton);

    return saveDialog;
}